

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_extensions.cpp
# Opt level: O3

void duckdb::DuckDBExtensionsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  idx_t iVar1;
  GlobalTableFunctionState *pGVar2;
  pointer pcVar3;
  reference pvVar4;
  char *pcVar5;
  _func_int **__n;
  ulong index;
  bool bVar6;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  Value local_a0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_60 [24];
  LogicalType local_48;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
              (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3) * -0x70a3d70a3d70a3d7)) {
    index = 0;
    do {
      pvVar4 = vector<duckdb::ExtensionInformation,_true>::operator[]
                         ((vector<duckdb::ExtensionInformation,_true> *)(pGVar2 + 1),(size_type)__n)
      ;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      pcVar3 = (pvVar4->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar3,pcVar3 + (pvVar4->name)._M_string_length);
      Value::Value(&local_a0,&local_e0);
      DataChunk::SetValue(output,0,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      Value::BOOLEAN(&local_a0,pvVar4->loaded);
      DataChunk::SetValue(output,1,index,&local_a0);
      Value::~Value(&local_a0);
      Value::BOOLEAN(&local_a0,pvVar4->installed);
      DataChunk::SetValue(output,2,index,&local_a0);
      Value::~Value(&local_a0);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      pcVar3 = (pvVar4->file_path)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar3,pcVar3 + (pvVar4->file_path)._M_string_length);
      Value::Value(&local_a0,&local_100);
      DataChunk::SetValue(output,3,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      pcVar3 = (pvVar4->description)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar3,pcVar3 + (pvVar4->description)._M_string_length);
      Value::Value(&local_a0,&local_120);
      DataChunk::SetValue(output,4,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      LogicalType::LogicalType(&local_48,VARCHAR);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                (local_60,&(pvVar4->aliases).
                           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
      Value::LIST(&local_a0,&local_48,(vector<duckdb::Value,_true> *)local_60);
      DataChunk::SetValue(output,5,index,&local_a0);
      Value::~Value(&local_a0);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_60);
      LogicalType::~LogicalType(&local_48);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      pcVar3 = (pvVar4->extension_version)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,pcVar3,pcVar3 + (pvVar4->extension_version)._M_string_length);
      Value::Value(&local_a0,&local_140);
      DataChunk::SetValue(output,6,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      pcVar5 = EnumUtil::ToChars<duckdb::ExtensionInstallMode>(pvVar4->install_mode);
      ::std::__cxx11::string::string((string *)&local_c0,pcVar5,(allocator *)&local_48);
      Value::Value(&local_a0,&local_c0);
      DataChunk::SetValue(output,7,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      pcVar3 = (pvVar4->installed_from)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar3,pcVar3 + (pvVar4->installed_from)._M_string_length);
      Value::Value(&local_a0,&local_160);
      DataChunk::SetValue(output,8,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      __n = (_func_int **)((long)pGVar2[4]._vptr_GlobalTableFunctionState + 1);
      pGVar2[4]._vptr_GlobalTableFunctionState = __n;
      iVar1 = index + 1;
    } while ((__n < (_func_int **)
                    (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
                      (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 3) * -0x70a3d70a3d70a3d7))
            && (bVar6 = index < 0x7ff, index = iVar1, bVar6));
    output->count = iVar1;
  }
  return;
}

Assistant:

void DuckDBExtensionsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBExtensionsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset];

		// return values:
		// extension_name LogicalType::VARCHAR
		output.SetValue(0, count, Value(entry.name));
		// loaded LogicalType::BOOLEAN
		output.SetValue(1, count, Value::BOOLEAN(entry.loaded));
		// installed LogicalType::BOOLEAN
		output.SetValue(2, count, Value::BOOLEAN(entry.installed));
		// install_path LogicalType::VARCHAR
		output.SetValue(3, count, Value(entry.file_path));
		// description LogicalType::VARCHAR
		output.SetValue(4, count, Value(entry.description));
		// aliases     LogicalType::LIST(LogicalType::VARCHAR)
		output.SetValue(5, count, Value::LIST(LogicalType::VARCHAR, entry.aliases));
		// extension version     LogicalType::LIST(LogicalType::VARCHAR)
		output.SetValue(6, count, Value(entry.extension_version));
		// installed_mode LogicalType::VARCHAR
		output.SetValue(7, count, EnumUtil::ToString(entry.install_mode));
		// installed_source LogicalType::VARCHAR
		output.SetValue(8, count, Value(entry.installed_from));

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}